

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

void __thiscall AlternativeLoader::AlternativeLoader(AlternativeLoader *this,string *mapFile)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  pcVar1 = (mapFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,pcVar1,pcVar1 + mapFile->_M_string_length);
  this->pDominationMapFile = psVar2;
  return;
}

Assistant:

AlternativeLoader::AlternativeLoader(const std::string& mapFile) {
    pDominationMapFile = new std::string(mapFile);
}